

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O3

void llvm::cl::tokenizeConfigFile
               (StringRef Source,StringSaver *Saver,SmallVectorImpl<const_char_*> *NewArgv,
               bool MarkEOLs)

{
  byte *pbVar1;
  ulong uVar2;
  undefined1 in_R9B;
  byte *in_start;
  byte *pbVar3;
  byte *pbVar4;
  byte *pbVar5;
  StringRef Src;
  SmallString<128U> Line;
  SmallVectorImpl<char> local_c0;
  cl local_b0 [128];
  
  if (Source.Length != 0) {
    pbVar5 = (byte *)(Source.Data + Source.Length);
    in_start = (byte *)Source.Data;
    do {
      local_c0.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>
      .super_SmallVectorBase.Size = 0;
      local_c0.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>
      .super_SmallVectorBase.Capacity = 0x80;
      uVar2 = (ulong)*in_start;
      pbVar1 = in_start;
      if (uVar2 < 0x24) {
        if ((0x100002600U >> (uVar2 & 0x3f) & 1) == 0) {
          if (uVar2 != 0x23) goto LAB_001689c7;
          if (in_start != pbVar5) {
            do {
              pbVar1 = in_start + 1;
              if (pbVar1 == pbVar5) break;
              in_start = pbVar1;
            } while (*pbVar1 != 10);
          }
        }
        else {
          while (((pbVar1 = in_start, in_start != pbVar5 && ((ulong)*in_start < 0x21)) &&
                 ((0x100002600U >> ((ulong)*in_start & 0x3f) & 1) != 0))) {
            in_start = in_start + 1;
          }
        }
      }
      else {
LAB_001689c7:
        local_c0.super_SmallVectorTemplateBase<char,_true>.
        super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX = local_b0;
        if (in_start != pbVar5) {
          do {
            pbVar4 = pbVar1;
            if ((char)uVar2 == '\\') {
              pbVar3 = pbVar1 + 1;
              if ((pbVar3 != pbVar5) &&
                 ((*pbVar3 == 10 ||
                  (((pbVar4 = pbVar3, *pbVar3 == 0xd && (pbVar1 + 2 != pbVar5)) && (pbVar1[2] == 10)
                   ))))) {
                SmallVectorImpl<char>::append<char_const*,void>
                          (&local_c0,(char *)in_start,(char *)pbVar1);
                if (pbVar1[1] == 0xd) {
                  pbVar3 = pbVar1 + 2;
                }
                in_start = pbVar3 + 1;
                pbVar4 = pbVar3;
              }
            }
            else if ((int)uVar2 == 10) break;
            pbVar1 = pbVar4 + 1;
            if (pbVar1 == pbVar5) break;
            uVar2 = (ulong)*pbVar1;
          } while( true );
        }
        SmallVectorImpl<char>::append<char_const*,void>(&local_c0,(char *)in_start,(char *)pbVar1);
        Src.Data = (char *)(local_c0.super_SmallVectorTemplateBase<char,_true>.
                            super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase._8_8_
                           & 0xffffffff);
        Src.Length = (size_t)Saver;
        TokenizeGNUCommandLine
                  ((cl *)local_c0.super_SmallVectorTemplateBase<char,_true>.
                         super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX,
                   Src,(StringSaver *)NewArgv,(SmallVectorImpl<const_char_*> *)(ulong)MarkEOLs,
                   (bool)in_R9B);
        if ((cl *)local_c0.super_SmallVectorTemplateBase<char,_true>.
                  super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX !=
            local_b0) {
          free(local_c0.super_SmallVectorTemplateBase<char,_true>.
               super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX);
        }
      }
      in_start = pbVar1;
    } while (pbVar1 != pbVar5);
  }
  return;
}

Assistant:

void cl::tokenizeConfigFile(StringRef Source, StringSaver &Saver,
                            SmallVectorImpl<const char *> &NewArgv,
                            bool MarkEOLs) {
  for (const char *Cur = Source.begin(); Cur != Source.end();) {
    SmallString<128> Line;
    // Check for comment line.
    if (isWhitespace(*Cur)) {
      while (Cur != Source.end() && isWhitespace(*Cur))
        ++Cur;
      continue;
    }
    if (*Cur == '#') {
      while (Cur != Source.end() && *Cur != '\n')
        ++Cur;
      continue;
    }
    // Find end of the current line.
    const char *Start = Cur;
    for (const char *End = Source.end(); Cur != End; ++Cur) {
      if (*Cur == '\\') {
        if (Cur + 1 != End) {
          ++Cur;
          if (*Cur == '\n' ||
              (*Cur == '\r' && (Cur + 1 != End) && Cur[1] == '\n')) {
            Line.append(Start, Cur - 1);
            if (*Cur == '\r')
              ++Cur;
            Start = Cur + 1;
          }
        }
      } else if (*Cur == '\n')
        break;
    }
    // Tokenize line.
    Line.append(Start, Cur);
    cl::TokenizeGNUCommandLine(Line, Saver, NewArgv, MarkEOLs);
  }
}